

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2FilterHandlers.cpp
# Opt level: O0

int __thiscall AttrList::getIndex(AttrList *this,XMLCh *qName)

{
  bool bVar1;
  XMLSize_t XVar2;
  Attr *pAVar3;
  ulong local_28;
  XMLSize_t i;
  XMLCh *qName_local;
  AttrList *this_local;
  
  local_28 = 0;
  while( true ) {
    XVar2 = xercesc_4_0::BaseRefVectorOf<Attr>::size
                      (&(this->super_RefVectorOf<Attr>).super_BaseRefVectorOf<Attr>);
    if (XVar2 <= local_28) {
      return -1;
    }
    pAVar3 = xercesc_4_0::BaseRefVectorOf<Attr>::elementAt
                       (&(this->super_RefVectorOf<Attr>).super_BaseRefVectorOf<Attr>,local_28);
    bVar1 = xercesc_4_0::XMLString::equals(pAVar3->qName,qName);
    if (bVar1) break;
    local_28 = local_28 + 1;
  }
  return (int)local_28;
}

Assistant:

virtual int getIndex(const XMLCh* const qName ) const
    {
        for(XMLSize_t i=0;i<size();i++)
            if(XMLString::equals(elementAt(i)->qName,qName))
                return (int)i;
        return -1;
    }